

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall Js::InterpreterStackFrame::Setup::SetupInternal(Setup *this)

{
  ushort uVar1;
  Type TVar2;
  NestedArray *pNVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  RegSlot RVar7;
  int iVar8;
  uint uVar9;
  IRecyclerVisitedObject in_RAX;
  undefined4 *puVar10;
  void **ppvVar11;
  FunctionBody *pFVar12;
  int iVar13;
  IRecyclerVisitedObject local_28;
  
  if (this->function->hasInlineCaches == true) {
    local_28._vptr_IRecyclerVisitedObject = in_RAX._vptr_IRecyclerVisitedObject;
    bVar5 = VarIsImpl<Js::ScriptFunctionWithInlineCache>((RecyclableObject *)this->function);
    if (!bVar5) goto LAB_008981c0;
    VarTo<Js::ScriptFunctionWithInlineCache,Js::ScriptFunction>(this->function);
    ScriptFunctionWithInlineCache::GetInlineCaches
              ((ScriptFunctionWithInlineCache *)&stack0xffffffffffffffd8);
    this->inlineCaches = local_28._vptr_IRecyclerVisitedObject;
    if (local_28._vptr_IRecyclerVisitedObject == (_func_int **)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x44e,"(this->inlineCaches != nullptr)",
                                  "this->inlineCaches != nullptr");
      if (!bVar5) goto LAB_00898386;
      *puVar10 = 0;
    }
  }
  else {
LAB_008981c0:
    ppvVar11 = FunctionBody::GetInlineCaches(this->executeFunction);
    this->inlineCaches = ppvVar11;
  }
  uVar6 = FunctionBody::GetInlineCacheCount(this->executeFunction);
  this->inlineCacheCount = uVar6;
  RVar7 = FunctionBody::GetLocalsCount(this->executeFunction);
  this->localCount = RVar7;
  bVar5 = DynamicProfileInfo::EnableImplicitCallFlags(this->executeFunction);
  if (bVar5) {
    uVar6 = FunctionBody::GetLoopCount(this->executeFunction);
    iVar13 = (int)((ulong)uVar6 + 7 >> 3) + 0x2c;
  }
  else {
    iVar13 = 0x2c;
  }
  if ((this->bailedOut != true) || (iVar8 = 0, this->isGeneratorFrame == true)) {
    uVar6 = FunctionBody::GetForInLoopDepth(this->executeFunction);
    iVar8 = uVar6 * 0xb;
  }
  uVar6 = this->localCount;
  RVar7 = FunctionBody::GetOutParamMaxDepth(this->executeFunction);
  uVar9 = FunctionBody::GetInnerScopeCount(this->executeFunction);
  this->varAllocCount = uVar9 + RVar7 + iVar13 + iVar8 + uVar6;
  this->stackVarAllocCount = 0;
  pFVar12 = this->executeFunction;
  if ((((((pFVar12->super_ParseableFunctionInfo).flags & Flags_StackNestedFunc) != Flags_None) &&
       (pNVar3 = (pFVar12->super_ParseableFunctionInfo).nestedArray.ptr,
       pNVar3 != (NestedArray *)0x0)) && (TVar2 = pNVar3->nestedCount, TVar2 != 0)) &&
     (this->stackVarAllocCount = TVar2 * 10, this->bailedOutOfInlinee == false)) {
    bVar5 = FunctionBody::DoStackFrameDisplay(pFVar12);
    pFVar12 = this->executeFunction;
    if (bVar5) {
      uVar1 = pFVar12->m_envDepth;
      if (uVar1 == 0xffff) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0x474,"(envDepth != (uint16)-1)","envDepth != (uint16)-1");
        if (!bVar5) goto LAB_00898386;
        *puVar10 = 0;
        pFVar12 = this->executeFunction;
      }
      this->stackVarAllocCount = this->stackVarAllocCount + (uint)uVar1 + 2;
    }
    bVar5 = FunctionBody::DoStackScopeSlots(pFVar12);
    if (bVar5) {
      TVar2 = (this->executeFunction->super_ParseableFunctionInfo).scopeSlotArraySize;
      if (TVar2 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0x47b,"(scopeSlots != 0)","scopeSlots != 0");
        if (!bVar5) {
LAB_00898386:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar10 = 0;
      }
      this->stackVarAllocCount = this->stackVarAllocCount + TVar2 + 2;
    }
  }
  return;
}

Assistant:

void InterpreterStackFrame::Setup::SetupInternal()
    {
        if (this->function->GetHasInlineCaches() && Js::VarIs<Js::ScriptFunctionWithInlineCache>(this->function))
        {
            this->inlineCaches = (void**)Js::VarTo<Js::ScriptFunctionWithInlineCache>(this->function)->GetInlineCaches();
            Assert(this->inlineCaches != nullptr);
        }
        else
        {
            this->inlineCaches = this->executeFunction->GetInlineCaches();
        }
        this->inlineCacheCount = this->executeFunction->GetInlineCacheCount();

        //
        // Compute the amount of memory needed on the stack:
        // - We compute this in 'Atoms' instead of 'bytes' to keep everything natural word aligned.
        //

        this->localCount = this->executeFunction->GetLocalsCount();
        uint extraVarCount = 0;
#if ENABLE_PROFILE_INFO
        if (Js::DynamicProfileInfo::EnableImplicitCallFlags(this->executeFunction))
        {
            extraVarCount += (sizeof(ImplicitCallFlags) * this->executeFunction->GetLoopCount() + sizeof(Var) - 1) / sizeof(Var);
        }
#endif
        // If we bailed out, we will use the JIT frame's for..in enumerators.
        // But for generators, we will allocate space for them instead.
        uint forInVarCount = (bailedOut && !isGeneratorFrame) ? 0 : (this->executeFunction->GetForInLoopDepth() * (sizeof(Js::ForInObjectEnumerator) / sizeof(Var)));
        this->varAllocCount = k_stackFrameVarCount + localCount + this->executeFunction->GetOutParamMaxDepth() + forInVarCount +
            extraVarCount + this->executeFunction->GetInnerScopeCount();
        this->stackVarAllocCount = 0;

        if (this->executeFunction->DoStackNestedFunc() && this->executeFunction->GetNestedCount() != 0)
        {
            // Track stack funcs...
            this->stackVarAllocCount += (sizeof(StackScriptFunction) * this->executeFunction->GetNestedCount()) / sizeof(Var);
            if (!this->bailedOutOfInlinee)
            {
                // Frame display (if environment depth is statically known)...
                if (this->executeFunction->DoStackFrameDisplay())
                {
                    uint16 envDepth = this->executeFunction->GetEnvDepth();
                    Assert(envDepth != (uint16)-1);
                    this->stackVarAllocCount += sizeof(FrameDisplay) / sizeof(Var) + (envDepth + 1);
                }
                // ...and scope slots (if any)
                if (this->executeFunction->DoStackScopeSlots())
                {
                    uint32 scopeSlots = this->executeFunction->scopeSlotArraySize;
                    Assert(scopeSlots != 0);
                    this->stackVarAllocCount += scopeSlots + Js::ScopeSlots::FirstSlotIndex;
                }
            }
        }
    }